

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cc
# Opt level: O2

clock_constraint_container_t * __thiscall
tchecker::zg::path::concrete::clockval_dbm_t::scale_up
          (clock_constraint_container_t *__return_storage_ptr__,clockval_dbm_t *this,
          clock_constraint_container_t *cc)

{
  pointer pcVar1;
  clock_constraint_t *c;
  pointer pcVar2;
  int local_40;
  ineq_cmp_t local_3c;
  clock_id_t local_38;
  clock_id_t local_34;
  
  (__return_storage_ptr__->
  super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar1 = (cc->
           super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pcVar2 = (cc->
                super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>
                )._M_impl.super__Vector_impl_data._M_start; pcVar2 != pcVar1; pcVar2 = pcVar2 + 1) {
    local_34 = pcVar2->_id1;
    local_38 = pcVar2->_id2;
    local_3c = pcVar2->_cmp;
    local_40 = this->_denominator * pcVar2->_value;
    std::vector<tchecker::clock_constraint_t,std::allocator<tchecker::clock_constraint_t>>::
    emplace_back<unsigned_int,unsigned_int,tchecker::ineq_cmp_t,int>
              ((vector<tchecker::clock_constraint_t,std::allocator<tchecker::clock_constraint_t>> *)
               __return_storage_ptr__,&local_34,&local_38,&local_3c,&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

tchecker::clock_constraint_container_t scale_up(tchecker::clock_constraint_container_t const & cc) const
  {
    tchecker::clock_constraint_container_t scaled_up_cc;
    for (tchecker::clock_constraint_t const & c : cc)
      scaled_up_cc.emplace_back(c.id1(), c.id2(), c.comparator(), c.value() * _denominator);
    return scaled_up_cc;
  }